

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

void __thiscall
helics::TimeDependencies::removeDependent(TimeDependencies *this,GlobalFederateId gid)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  pointer pDVar4;
  BaseType in_ESI;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *in_RDI;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  dep;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_18 [2];
  GlobalFederateId local_4;
  
  local_4.gid = in_ESI;
  iVar2 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                    (in_RDI);
  iVar3 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end(in_RDI);
  local_18[0] = std::
                lower_bound<__gnu_cxx::__normal_iterator<helics::DependencyInfo*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,helics::GlobalFederateId,helics::__0>
                          (iVar2._M_current,iVar3._M_current,&local_4);
  iVar2 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end(in_RDI);
  bVar1 = __gnu_cxx::
          operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                    ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                      *)in_stack_ffffffffffffffb0,
                     (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                      *)in_RDI);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pDVar4 = __gnu_cxx::
             __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
             ::operator->(local_18);
    bVar1 = GlobalFederateId::operator==(&pDVar4->fedID,local_4);
    if (bVar1) {
      pDVar4 = __gnu_cxx::
               __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
               ::operator->(local_18);
      pDVar4->dependent = false;
      pDVar4 = __gnu_cxx::
               __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
               ::operator->(local_18);
      if ((pDVar4->dependency & 1U) == 0) {
        __gnu_cxx::
        __normal_iterator<helics::DependencyInfo_const*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>
        ::__normal_iterator<helics::DependencyInfo*>
                  (in_stack_ffffffffffffffb0,
                   (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                    *)in_RDI);
        std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::erase
                  ((vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *)
                   CONCAT44(local_4.gid,in_stack_ffffffffffffffc0),(const_iterator)iVar2._M_current)
        ;
      }
    }
  }
  return;
}

Assistant:

void TimeDependencies::removeDependent(GlobalFederateId gid)
{
    auto dep = std::lower_bound(dependencies.begin(), dependencies.end(), gid, dependencyCompare);
    if (dep != dependencies.end()) {
        if (dep->fedID == gid) {
            dep->dependent = false;
            if (!dep->dependency) {
                dependencies.erase(dep);
            }
        }
    }
}